

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void prepenum(rnndb *db,rnnenum *en)

{
  char *pcVar1;
  char *local_38;
  int local_1c;
  int i;
  rnnenum *en_local;
  rnndb *db_local;
  
  if ((en->prepared == 0) &&
     (prepvarinfo(db,en->name,&en->varinfo,(rnnvarinfo *)0x0), en->isinline == 0)) {
    for (local_1c = 0; local_1c < en->valsnum; local_1c = local_1c + 1) {
      if (en->bare == 0) {
        local_38 = en->name;
      }
      else {
        local_38 = (char *)0x0;
      }
      prepvalue(db,en->vals[local_1c],local_38,&en->varinfo);
    }
    pcVar1 = catstr((en->varinfo).prefix,en->name);
    en->fullname = pcVar1;
    en->prepared = 1;
  }
  return;
}

Assistant:

static void prepenum(struct rnndb *db, struct rnnenum *en) {
	if (en->prepared)
		return;
	prepvarinfo (db, en->name, &en->varinfo, 0);
	int i;
	if (en->isinline)
		return;
	for (i = 0; i < en->valsnum; i++)
		prepvalue(db, en->vals[i], en->bare?0:en->name, &en->varinfo);
	en->fullname = catstr(en->varinfo.prefix, en->name);
	en->prepared = 1;
}